

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.c
# Opt level: O0

sexp_conflict
sexp_lgamma_r_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0)

{
  long lVar1;
  int *in_RCX;
  undefined8 in_RSI;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict res1;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res;
  int tmp1;
  double *local_60;
  undefined8 local_58;
  double local_50;
  sexp_conflict *local_48;
  undefined8 local_40;
  sexp_conflict local_38;
  int local_2c;
  int *local_28;
  undefined8 local_18;
  long local_10;
  sexp_conflict local_8;
  
  local_38 = (sexp_conflict)0x43e;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_48,0,0x10);
  local_50 = 5.36555291383594e-321;
  memset(&local_60,0,0x10);
  lVar1 = local_10;
  if ((((ulong)local_28 & 3) == 0) && (*local_28 == 0xb)) {
    local_48 = &local_38;
    local_40 = *(undefined8 *)(local_10 + 0x6080);
    *(sexp_conflict ***)(local_10 + 0x6080) = &local_48;
    local_60 = &local_50;
    local_58 = *(undefined8 *)(local_10 + 0x6080);
    *(double ***)(local_10 + 0x6080) = &local_60;
    lgamma_r(*(double *)(local_28 + 2),&local_2c);
    local_38 = (sexp_conflict)sexp_make_flonum(lVar1);
    local_50 = (double)sexp_make_integer(local_10,(long)local_2c,(long)local_2c >> 0x3f);
    local_38 = (sexp_conflict)sexp_cons_op(local_10,0,2,local_38,0x23e);
    sexp_push_op(local_10,&local_38,(local_38->value).flonum);
    (((local_38->value).type.cpl)->value).flonum = local_50;
    *(undefined8 *)(local_10 + 0x6080) = local_40;
    local_8 = local_38;
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(local_10,local_18,0xb,local_28);
  }
  return local_8;
}

Assistant:

sexp sexp_lgamma_r_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0) {
  int tmp1;
  sexp_gc_var2(res, res1);
  if (! sexp_flonump(arg0))
    return sexp_type_exception(ctx, self, SEXP_FLONUM, arg0);
  sexp_gc_preserve2(ctx, res, res1);
  res = sexp_make_flonum(ctx, lgamma_r(sexp_flonum_value(arg0), &tmp1));
  res1 = sexp_make_integer(ctx, tmp1);
  res = sexp_cons(ctx, res, SEXP_NULL);
  sexp_push(ctx, res, sexp_car(res));
  sexp_cadr(res) = res1;
  sexp_gc_release2(ctx);
  return res;
}